

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I420Blend(uint8_t *src_y0,int src_stride_y0,uint8_t *src_u0,int src_stride_u0,uint8_t *src_v0,
             int src_stride_v0,uint8_t *src_y1,int src_stride_y1,uint8_t *src_u1,int src_stride_u1,
             uint8_t *src_v1,int src_stride_v1,uint8_t *alpha,int alpha_stride,uint8_t *dst_y,
             int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,int dst_stride_v,
             int width,int height)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000018;
  uint8_t *halfalpha;
  uint8_t *halfalpha_mem;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_int *ScaleRowDown2;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *BlendPlaneRow;
  int in_stack_00000040;
  int halfwidth;
  int y;
  undefined4 in_stack_00000058;
  undefined4 in_stack_00000068;
  uint in_stack_00000078;
  int in_stack_00000080;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  code *pcVar4;
  code *local_50;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  int local_c;
  
  uVar1 = (int)(in_stack_00000078 + 1) >> 1;
  local_50 = BlendPlaneRow_C;
  pcVar4 = ScaleRowDown2Box_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((((in_stack_00000008 == 0 || (in_stack_00000018 == 0)) ||
        ((halfalpha_mem == (uint8_t *)0x0 ||
         ((BlendPlaneRow == (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *)0x0 ||
          (_y == 0)))))) || (_in_stack_00000058 == 0)))) ||
     (((_in_stack_00000068 == 0 || ((int)in_stack_00000078 < 1)) || (in_stack_00000080 == 0)))) {
    local_c = -1;
  }
  else {
    if (in_stack_00000080 < 0) {
      in_stack_00000080 = -in_stack_00000080;
    }
    BlendPlane((uint8_t *)ScaleRowDown2Box_C,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_00000078),
               in_stack_ffffffffffffff84,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),
               (int)in_R8,in_stack_ffffffffffffffd0,(int)in_RDX);
    iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffff84);
    if ((iVar2 != 0) && (local_50 = BlendPlaneRow_Any_SSSE3, (uVar1 & 7) == 0)) {
      local_50 = BlendPlaneRow_SSSE3;
    }
    iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffff84);
    if ((iVar2 != 0) && (local_50 = BlendPlaneRow_Any_AVX2, (uVar1 & 0x1f) == 0)) {
      local_50 = BlendPlaneRow_AVX2;
    }
    if ((in_stack_00000078 & 1) != 0) {
      pcVar4 = ScaleRowDown2Box_Odd_C;
    }
    iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffff84);
    if (((iVar2 != 0) && (pcVar4 = ScaleRowDown2Box_Odd_SSSE3, (in_stack_00000078 & 1) == 0)) &&
       (pcVar4 = ScaleRowDown2Box_Any_SSSE3, (uVar1 & 0xf) == 0)) {
      pcVar4 = ScaleRowDown2Box_SSSE3;
    }
    iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffff84);
    if (((iVar2 != 0) && (pcVar4 = ScaleRowDown2Box_Odd_AVX2, (in_stack_00000078 & 1) == 0)) &&
       (pcVar4 = ScaleRowDown2Box_Any_AVX2, (uVar1 & 0x1f) == 0)) {
      pcVar4 = ScaleRowDown2Box_AVX2;
    }
    __ptr = malloc((long)(int)(uVar1 + 0x3f));
    uVar3 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
    iVar2 = 0;
    while( true ) {
      if (in_stack_00000080 <= iVar2) break;
      if (iVar2 == in_stack_00000080 + -1) {
        in_stack_00000040 = 0;
      }
      (*pcVar4)(BlendPlaneRow,(long)in_stack_00000040,uVar3,uVar1);
      BlendPlaneRow = BlendPlaneRow + (in_stack_00000040 << 1);
      (*local_50)(in_RDX,in_stack_00000018,uVar3,_in_stack_00000058,uVar1);
      (*local_50)(in_R8,halfalpha_mem,uVar3,_in_stack_00000068,uVar1);
      in_RDX = in_RDX + in_ECX;
      in_stack_00000018 = in_stack_00000018 + (int)halfalpha;
      _in_stack_00000058 = _in_stack_00000058 + (int)src_u0;
      in_R8 = in_R8 + in_R9D;
      halfalpha_mem = halfalpha_mem + (int)ScaleRowDown2;
      _in_stack_00000068 = _in_stack_00000068 + (int)src_y0;
      iVar2 = iVar2 + 2;
    }
    free(__ptr);
    local_c = 0;
  }
  return local_c;
}

Assistant:

LIBYUV_API
int I420Blend(const uint8_t* src_y0,
              int src_stride_y0,
              const uint8_t* src_u0,
              int src_stride_u0,
              const uint8_t* src_v0,
              int src_stride_v0,
              const uint8_t* src_y1,
              int src_stride_y1,
              const uint8_t* src_u1,
              int src_stride_u1,
              const uint8_t* src_v1,
              int src_stride_v1,
              const uint8_t* alpha,
              int alpha_stride,
              uint8_t* dst_y,
              int dst_stride_y,
              uint8_t* dst_u,
              int dst_stride_u,
              uint8_t* dst_v,
              int dst_stride_v,
              int width,
              int height) {
  int y;
  // Half width/height for UV.
  int halfwidth = (width + 1) >> 1;
  void (*BlendPlaneRow)(const uint8_t* src0, const uint8_t* src1,
                        const uint8_t* alpha, uint8_t* dst, int width) =
      BlendPlaneRow_C;
  void (*ScaleRowDown2)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                        uint8_t* dst_ptr, int dst_width) = ScaleRowDown2Box_C;
  if (!src_y0 || !src_u0 || !src_v0 || !src_y1 || !src_u1 || !src_v1 ||
      !alpha || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }

  // Blend Y plane.
  BlendPlane(src_y0, src_stride_y0, src_y1, src_stride_y1, alpha, alpha_stride,
             dst_y, dst_stride_y, width, height);

#if defined(HAS_BLENDPLANEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    BlendPlaneRow = BlendPlaneRow_Any_SSSE3;
    if (IS_ALIGNED(halfwidth, 8)) {
      BlendPlaneRow = BlendPlaneRow_SSSE3;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    BlendPlaneRow = BlendPlaneRow_Any_AVX2;
    if (IS_ALIGNED(halfwidth, 32)) {
      BlendPlaneRow = BlendPlaneRow_AVX2;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    BlendPlaneRow = BlendPlaneRow_Any_MMI;
    if (IS_ALIGNED(halfwidth, 8)) {
      BlendPlaneRow = BlendPlaneRow_MMI;
    }
  }
#endif
  if (!IS_ALIGNED(width, 2)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_C;
  }
#if defined(HAS_SCALEROWDOWN2_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_NEON;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_NEON;
      if (IS_ALIGNED(halfwidth, 16)) {
        ScaleRowDown2 = ScaleRowDown2Box_NEON;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_SSSE3;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_SSSE3;
      if (IS_ALIGNED(halfwidth, 16)) {
        ScaleRowDown2 = ScaleRowDown2Box_SSSE3;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_AVX2;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_AVX2;
      if (IS_ALIGNED(halfwidth, 32)) {
        ScaleRowDown2 = ScaleRowDown2Box_AVX2;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_MMI;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_MMI;
      if (IS_ALIGNED(halfwidth, 8)) {
        ScaleRowDown2 = ScaleRowDown2Box_MMI;
      }
    }
  }
#endif

  // Row buffer for intermediate alpha pixels.
  align_buffer_64(halfalpha, halfwidth);
  for (y = 0; y < height; y += 2) {
    // last row of odd height image use 1 row of alpha instead of 2.
    if (y == (height - 1)) {
      alpha_stride = 0;
    }
    // Subsample 2 rows of UV to half width and half height.
    ScaleRowDown2(alpha, alpha_stride, halfalpha, halfwidth);
    alpha += alpha_stride * 2;
    BlendPlaneRow(src_u0, src_u1, halfalpha, dst_u, halfwidth);
    BlendPlaneRow(src_v0, src_v1, halfalpha, dst_v, halfwidth);
    src_u0 += src_stride_u0;
    src_u1 += src_stride_u1;
    dst_u += dst_stride_u;
    src_v0 += src_stride_v0;
    src_v1 += src_stride_v1;
    dst_v += dst_stride_v;
  }
  free_aligned_buffer_64(halfalpha);
  return 0;
}